

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_parse_custom_request(connectdata *conn)

{
  SessionHandle *data_00;
  char *string;
  char *custom;
  SMTP *smtp;
  SessionHandle *data;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  string = (data_00->set).str[4];
  if (string != (char *)0x0) {
    data._4_4_ = Curl_urldecode(data_00,string,0,(char **)((long)(data_00->req).protop + 8),
                                (size_t *)0x0,true);
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_parse_custom_request(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  const char *custom = data->set.str[STRING_CUSTOMREQUEST];

  /* URL decode the custom request */
  if(custom)
    result = Curl_urldecode(data, custom, 0, &smtp->custom, NULL, TRUE);

  return result;
}